

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>>::ScanStringConstant<true,true>
          (Scanner<UTF8EncodingPolicyBase<false>> *this,OLECHAR delim,EncodedCharPtr *pp)

{
  byte *pbVar1;
  byte *end;
  undefined8 *puVar2;
  code *pcVar3;
  char16 cVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  IdentPtr pIVar7;
  HRESULT hr;
  int iVar8;
  uint uVar9;
  char16 cVar10;
  bool bVar11;
  char16 local_52;
  TemporaryBuffer *pTStack_50;
  OLECHAR lower;
  uint local_44;
  byte *pbStack_40;
  int wT;
  EncodedCharPtr p;
  OLECHAR ch;
  
  pbStack_40 = *pp;
  end = *(byte **)(this + 0x4c8);
  this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] & 0xf3);
  *(undefined4 *)(this + 0x51c) = 0;
  pTStack_50 = (TemporaryBuffer *)(this + 0x628);
  *(undefined4 *)(this + 0x634) = 0;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  while( true ) {
    pbVar1 = pbStack_40 + 1;
    if (pbStack_40 < end) {
      p._6_2_ = (char16)*pbStack_40;
    }
    else {
      p._6_2_ = L'\0';
    }
    cVar10 = p._6_2_;
    if ((ushort)p._6_2_ < 0x24) break;
    if ((ushort)p._6_2_ < 0x5c) {
      if (p._6_2_ == L'$') {
        if ((pbVar1 < end) && (*pbVar1 == 0x7b)) goto LAB_00f179df;
      }
      else if (p._6_2_ == L'\'') {
LAB_00f1740e:
        pbStack_40 = pbVar1;
        if (p._6_2_ == delim) {
LAB_00f179df:
          if ((((byte)this[0x508] & 0x40) == 0) ||
             ((*(int *)(this + 0x51c) == 10 &&
              (**(undefined1 (**) [16])(this + 0x520) == _DAT_011c5b00 &&
               ZEXT416(*(uint *)(*(undefined1 (**) [16])(this + 0x520))[1]) == _DAT_011c5af0)))) {
            puVar2 = *(undefined8 **)(this + 0x4b8);
            pIVar7 = HashTbl::PidHashNameLen<char16_t>
                               ((HashTbl *)(this + 0x20),*(char16_t **)(this + 0x520),
                                *(uint32 *)(this + 0x51c));
            *puVar2 = pIVar7;
            puVar2[1] = 0;
          }
          else {
            **(undefined1 (**) [16])(this + 0x4b8) = (undefined1  [16])0x0;
          }
          *(undefined4 *)(this + 0x744) = 0;
          this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)
                        ((byte)this[0x508] & 0xfd | (delim == L'\"') * '\x02');
          *pp = pbStack_40;
          return tkStrCon;
        }
        goto LAB_00f179b4;
      }
LAB_00f1755b:
      if (0x7f < (ushort)p._6_2_) {
        pbStack_40 = pbVar1;
        p._6_2_ = utf8::DecodeTail(p._6_2_,&stack0xffffffffffffffc0,end,
                                   (DecodeOptions *)(this + 0x10),(bool *)0x0);
        *(byte **)(this + 8) = pbStack_40 + (*(long *)(this + 8) - (long)pbVar1);
        pbVar1 = pbStack_40;
        cVar10 = p._6_2_;
      }
      goto LAB_00f179b4;
    }
    if (p._6_2_ != L'\\') {
      if (p._6_2_ == L'`') goto LAB_00f179df;
      goto LAB_00f1755b;
    }
    pbStack_40 = pbVar1;
    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>(pTStack_50,0x5c);
    this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] | 8);
    pbVar1 = pbStack_40 + 1;
    if (pbStack_40 < end) {
      cVar10 = (char16)*pbStack_40;
    }
    else {
      cVar10 = L'\0';
    }
    uVar9 = (uint)(ushort)cVar10;
    p._6_2_ = cVar10;
    if (uVar9 < 0x62) {
      cVar4 = cVar10;
      if (uVar9 < 0x30) {
        if (uVar9 != 0) {
          if (uVar9 != 10) {
            if (uVar9 != 0xd) goto switchD_00f1750e_caseD_6f;
            cVar10 = L'\n';
            if ((pbVar1 < end) && (*pbVar1 == 10)) {
              pbVar1 = pbStack_40 + 2;
            }
          }
LAB_00f17847:
          pbStack_40 = pbVar1;
          Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                    (pTStack_50,(uint)(ushort)cVar10);
          *(int *)(this + 0x740) = *(int *)(this + 0x740) + 1;
          *(undefined8 *)(this + 0x4e8) = *(undefined8 *)(this + 0x4d0);
          *(undefined8 *)(this + 0x4d0) = *(undefined8 *)(this + 0x4e0);
          *(undefined8 *)(this + 0x4f8) = *(undefined8 *)(this + 8);
          *(byte **)(this + 0x4d0) = pbStack_40;
          bVar11 = true;
          goto LAB_00f179a7;
        }
        if (end <= pbVar1) {
          hr = -0x7ff5fc09;
          pbStack_40 = pbVar1;
          goto LAB_00f17aca;
        }
        pbStack_40 = pbVar1;
        cVar10 = L'0';
      }
      else {
        hr = -0x7ff5fbf1;
        if (3 < uVar9 - 0x30) {
          pbStack_40 = pbVar1;
          if (uVar9 - 0x34 < 4) goto LAB_00f17aca;
          goto switchD_00f1750e_caseD_6f;
        }
        cVar4 = (char16)(uVar9 - 0x30);
        if (pbVar1 < end) {
          bVar11 = (*pbVar1 & 0xf8) == 0x30;
        }
        else {
          bVar11 = false;
        }
        pbStack_40 = pbVar1;
        if ((cVar4 != L'\0') || (p._6_2_ = L'\0', bVar11)) goto LAB_00f17aca;
      }
      goto LAB_00f179a4;
    }
    switch(uVar9) {
    case 0x6e:
      p._6_2_ = L'\n';
      pbStack_40 = pbVar1;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x77:
switchD_00f1750e_caseD_6f:
      pbStack_40 = pbVar1;
      if (uVar9 < 0x80) break;
      bVar11 = false;
      p._6_2_ = utf8::DecodeTail(cVar10,&stack0xffffffffffffffc0,end,(DecodeOptions *)(this + 0x10),
                                 (bool *)0x0);
      *(byte **)(this + 8) = pbStack_40 + (*(long *)(this + 8) - (long)pbVar1);
      pbVar1 = pbStack_40;
      cVar10 = p._6_2_;
      if ((p._6_2_ & 0xfffeU) == 0x2028) goto LAB_00f17847;
      goto LAB_00f179a7;
    case 0x72:
      p._6_2_ = L'\r';
      pbStack_40 = pbVar1;
      break;
    case 0x74:
      p._6_2_ = L'\t';
      pbStack_40 = pbVar1;
      break;
    case 0x75:
      pbStack_40 = pbVar1;
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>(pTStack_50,0x75);
      p._6_2_ = L'\0';
      if (pbStack_40 < end) {
        cVar10 = (char16)*pbStack_40;
      }
      else {
        cVar10 = L'\0';
      }
      pbStack_40 = pbStack_40 + 1;
      BVar5 = Js::NumberUtilities::FHexDigit(cVar10,(int *)&local_44);
      if (BVar5 != 0) {
        Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                  (pTStack_50,(uint)(ushort)cVar10);
        uVar9 = local_44;
        if (pbStack_40 < end) {
          cVar10 = (char16)*pbStack_40;
        }
        else {
          cVar10 = L'\0';
        }
        pbStack_40 = pbStack_40 + 1;
        BVar5 = Js::NumberUtilities::FHexDigit(cVar10,(int *)&local_44);
        if (BVar5 != 0) {
          Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                    (pTStack_50,(uint)(ushort)cVar10);
          iVar8 = local_44 * 0x100 + uVar9 * 0x1000;
          goto LAB_00f17751;
        }
        goto LAB_00f17ab7;
      }
      hr = -0x7ff5fc01;
      cVar4 = p._6_2_;
      if ((cVar10 != L'{') || (this[0x509] != (Scanner<UTF8EncodingPolicyBase<false>>)0x1))
      goto LAB_00f17aca;
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>(pTStack_50,0x7b);
      if (pbStack_40 < end) {
        cVar10 = (char16)*pbStack_40;
      }
      else {
        cVar10 = L'\0';
      }
      pbStack_40 = pbStack_40 + 1;
      BVar5 = Js::NumberUtilities::FHexDigit(cVar10,(int *)&local_44);
      hr = -0x7ff5fc01;
      cVar4 = p._6_2_;
      if (BVar5 == 0) goto LAB_00f17aca;
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                (pTStack_50,(uint)(ushort)cVar10);
      uVar9 = local_44;
      while( true ) {
        if (pbStack_40 < end) {
          cVar10 = (char16)*pbStack_40;
        }
        else {
          cVar10 = L'\0';
        }
        pbStack_40 = pbStack_40 + 1;
        BVar5 = Js::NumberUtilities::FHexDigit(cVar10,(int *)&local_44);
        if (BVar5 == 0) break;
        Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                  (pTStack_50,(uint)(ushort)cVar10);
        uVar9 = uVar9 * 0x10 + local_44;
        if (0x10ffff < uVar9) {
          hr = -0x7ff5fbd9;
          cVar4 = p._6_2_;
          goto LAB_00f17aca;
        }
      }
      if (cVar10 != L'}') {
        hr = -0x7ff5fbd8;
        cVar4 = p._6_2_;
        goto LAB_00f17aca;
      }
      if (0x10ffff < uVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                            ,0x4bd,"(codePoint <= 0x10FFFF)","codePoint <= 0x10FFFF");
        if (!bVar11) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      cVar10 = L'}';
      if (0xffff < uVar9) {
        local_52 = L'\0';
        Js::NumberUtilities::CodePointAsSurrogatePair(uVar9,&local_52,(char16 *)((long)&p + 6));
        Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                  ((TemporaryBuffer *)(this + 0x510),(uint)(ushort)local_52);
        break;
      }
LAB_00f177e1:
      p._6_2_ = (char16)uVar9;
      break;
    case 0x76:
      p._6_2_ = L'\v';
      pbStack_40 = pbVar1;
      break;
    case 0x78:
      pbStack_40 = pbVar1;
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>(pTStack_50,0x78);
      p._6_2_ = L'\0';
      iVar8 = 0;
LAB_00f17751:
      if (pbStack_40 < end) {
        cVar10 = (char16)*pbStack_40;
      }
      else {
        cVar10 = L'\0';
      }
      pbStack_40 = pbStack_40 + 1;
      BVar5 = Js::NumberUtilities::FHexDigit(cVar10,(int *)&local_44);
      if (BVar5 != 0) {
        Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                  (pTStack_50,(uint)(ushort)cVar10);
        uVar9 = local_44;
        if (pbStack_40 < end) {
          cVar10 = (char16)*pbStack_40;
        }
        else {
          cVar10 = L'\0';
        }
        pbStack_40 = pbStack_40 + 1;
        BVar5 = Js::NumberUtilities::FHexDigit(cVar10,(int *)&local_44);
        if (BVar5 != 0) {
          uVar9 = uVar9 * 0x10 + iVar8 + local_44;
          hr = -0x7ff5fc01;
          cVar4 = p._6_2_;
          if (0xffff < uVar9) goto LAB_00f17aca;
          goto LAB_00f177e1;
        }
      }
LAB_00f17ab7:
      hr = -0x7ff5fc01;
      cVar4 = p._6_2_;
LAB_00f17aca:
      p._6_2_ = cVar4;
      *(byte **)(this + 0x4e0) = pbStack_40 + -1;
      Scanner<UTF8EncodingPolicyBase<false>_>::Error
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,hr);
    default:
      if (uVar9 == 0x66) {
        p._6_2_ = L'\f';
        pbStack_40 = pbVar1;
      }
      else {
        if (uVar9 != 0x62) goto switchD_00f1750e_caseD_6f;
        p._6_2_ = L'\b';
        pbStack_40 = pbVar1;
      }
    }
LAB_00f179a4:
    bVar11 = false;
LAB_00f179a7:
    pbVar1 = pbStack_40;
    if (!bVar11) {
LAB_00f179b4:
      pbStack_40 = pbVar1;
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                ((TemporaryBuffer *)(this + 0x510),(uint)(ushort)p._6_2_);
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                (pTStack_50,(uint)(ushort)cVar10);
    }
  }
  if ((ushort)p._6_2_ < 0xd) {
    if (p._6_2_ != L'\0') {
      pbStack_40 = pbVar1;
      if (p._6_2_ == L'\n') goto LAB_00f174a6;
      goto LAB_00f1755b;
    }
    if (end < pbVar1) {
      *(byte **)(this + 0x4e0) = pbStack_40;
      pbStack_40 = pbVar1;
      Scanner<UTF8EncodingPolicyBase<false>_>::Error
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,-0x7ff5fc09);
    }
  }
  else {
    if (p._6_2_ != L'\r') {
      if (p._6_2_ == L'\"') goto LAB_00f1740e;
      goto LAB_00f1755b;
    }
    if ((pbVar1 < end) && (*pbVar1 == 10)) {
      pbVar1 = pbStack_40 + 2;
    }
    pbStack_40 = pbVar1;
    p._6_2_ = L'\n';
LAB_00f174a6:
    *(int *)(this + 0x740) = *(int *)(this + 0x740) + 1;
    *(undefined8 *)(this + 0x4e8) = *(undefined8 *)(this + 0x4d0);
    *(undefined8 *)(this + 0x4d0) = *(undefined8 *)(this + 0x4e0);
    *(undefined8 *)(this + 0x4f8) = *(undefined8 *)(this + 8);
    *(byte **)(this + 0x4d0) = pbStack_40;
    pbVar1 = pbStack_40;
    cVar10 = p._6_2_;
  }
  goto LAB_00f179b4;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanStringConstant(OLECHAR delim, EncodedCharPtr *pp)
{
    static_assert((stringTemplateMode && createRawString) || (!stringTemplateMode && !createRawString), "stringTemplateMode and createRawString must have the same value");

    OLECHAR ch, c, rawch;
    int wT;
    EncodedCharPtr p = *pp;
    EncodedCharPtr last = m_pchLast;

    // Reset
    m_OctOrLeadingZeroOnLastTKNumber = false;
    m_EscapeOnLastTkStrCon = FALSE;

    m_tempChBuf.Reset();

    // Use template parameter to gate raw string creation.
    // If createRawString is false, all these operations should be no-ops
    if (createRawString)
    {
        m_tempChBufSecondary.Reset();
    }

    for (;;)
    {
        switch ((rawch = ch = this->ReadFirst(p, last)))
        {
        case kchRET:
            if (stringTemplateMode)
            {
                if (this->PeekFirst(p, last) == kchNWL)
                {
                    // Eat the <LF> char, ignore return
                    this->ReadFirst(p, last);
                }

                // Both <CR> and <CR><LF> are normalized to <LF> in template cooked and raw values
                ch = rawch = kchNWL;
            }

            // Fall through
        case kchNWL:
            if (stringTemplateMode)
            {
                // Notify the scanner to update current line, number of lines etc
                NotifyScannedNewLine();

                // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                m_pchMinLine = p;

                break;
            }

            m_currentCharacter = p - 1;
            Error(ERRnoStrEnd);

        case '"':
        case '\'':
            if (ch == delim)
                goto LBreak;
            break;

        case '`':
            // In string template scan mode, don't consume the '`' - we need to differentiate
            // between a closed string template and the expression open sequence - ${
            if (stringTemplateMode)
            {
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case '$':
            // If we are parsing a string literal part of a string template, ${ indicates we need to switch
            // to parsing an expression.
            if (stringTemplateMode && this->PeekFirst(p, last) == '{')
            {
                // Rewind to the $ and return
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case kchNUL:
            if (p > last)
            {
                m_currentCharacter = p - 1;
                Error(ERRnoStrEnd);
            }
            break;

        default:
LMainDefault:
            if (this->IsMultiUnitChar(ch))
            {
                rawch = ch = this->template ReadRest<true>(ch, p, last);
            }
            break;

        case kchBSL:
            // In raw mode '\\' is not an escape character, just add the char into the raw buffer.
            m_tempChBufSecondary.template AppendCh<createRawString>(ch);

            m_EscapeOnLastTkStrCon=TRUE;

            // In raw mode, we append the raw char itself and not the escaped value so save the char.
            rawch = ch = this->ReadFirst(p, last);
            codepoint_t codePoint = 0;
            uint errorType = (uint)ERRbadHexDigit;
            switch (ch)
            {
            case 'b':
                ch = 0x08;
                break;
            case 't':
                ch = 0x09;
                break;
            case 'v':
                ch = 0x0B; //Only in ES5 mode
                break; //same as default
            case 'n':
                ch = 0x0A;
                break;
            case 'f':
                ch = 0x0C;
                break;
            case 'r':
                ch = 0x0D;
                break;
            case 'x':
                // Insert the 'x' here before jumping to parse the hex digits.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                // 2 hex digits
                ch = 0;
                goto LTwoHex;
            case 'u':
                // Raw string just inserts a 'u' here.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                ch = 0;
                if (Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto LFourHex;
                else if (c != '{' || !this->es6UnicodeMode)
                    goto ReturnScanError;

                Assert(c == '{');
                // c should definitely be a '{' which should be appended to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                //At least one digit is expected
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    goto ReturnScanError;
                }

                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint = static_cast<codepoint_t>(wT);

                while(Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    m_tempChBufSecondary.template AppendCh<createRawString>(c);
                    codePoint <<= 4;
                    codePoint += static_cast<codepoint_t>(wT);

                    if (codePoint > 0x10FFFF)
                    {
                        errorType = (uint)ERRInvalidCodePoint;
                        goto ReturnScanError;
                    }
                }

                if (c != '}')
                {
                    errorType = (uint)ERRMissingCurlyBrace;
                    goto ReturnScanError;
                }

                Assert(codePoint <= 0x10FFFF);

                if (codePoint >= 0x10000)
                {
                    OLECHAR lower = 0;
                    Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &ch);
                    m_tempChBuf.AppendCh(lower);
                }
                else
                {
                    ch = (char16)codePoint;
                }

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                break;
LFourHex:
                codePoint = 0x0;
                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x1000);
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append fourth (or second) hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0100);

LTwoHex:
                // This code path doesn't expect curly.
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0010);

                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                codePoint += static_cast<codepoint_t>(wT);

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                if (codePoint < 0x10000)
                {
                    ch = static_cast<OLECHAR>(codePoint);
                }
                else
                {
                    goto ReturnScanError;
                }
                break;
            case '0':
            case '1':
            case '2':
            case '3':
                // 1 to 3 octal digits

                ch -= '0';

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    c = this->PeekFirst(p, last);
                    if (ch != 0 || (c >= '0' && c <= '7'))
                    {
                        errorType = (uint)ERRES5NoOctal;
                        goto ReturnScanError;
                    }
                    break;
                }

                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    if (ch != 0 || ((char16)wT <= 9))
                    {
                        m_OctOrLeadingZeroOnLastTKNumber = true;
                    }
                    p--;
                    break;
                }

                m_OctOrLeadingZeroOnLastTKNumber = true;
                ch = static_cast< OLECHAR >(ch * 8 + wT);
                goto LOneOctal;
            case '4':
            case '5':
            case '6':
            case '7':
                // 1 to 2 octal digits

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    errorType = (uint)ERRES5NoOctal;
                    goto ReturnScanError;
                }

                ch -= '0';

                m_OctOrLeadingZeroOnLastTKNumber = true;

LOneOctal:
                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    p--;
                    break;
                }

                ch = static_cast< OLECHAR >(ch * 8 + wT);
                break;

            case kchRET:        // 0xD
                if (stringTemplateMode)
                {
                    // If this is \<CR><LF> we can eat the <LF> right now
                    if (this->PeekFirst(p, last) == kchNWL)
                    {
                        // Eat the <LF> char, ignore return
                        this->ReadFirst(p, last);
                    }

                    // Both \<CR> and \<CR><LF> are normalized to \<LF> in template raw string
                    rawch = kchNWL;
                }
            case kchLS:         // 0x2028, classifies as new line
            case kchPS:         // 0x2029, classifies as new line
            case kchNWL:        // 0xA
LEcmaEscapeLineBreak:
                if (stringTemplateMode)
                {
                    // We're going to ignore the line continuation tokens for the cooked strings, but we need to append the token for raw strings
                    m_tempChBufSecondary.template AppendCh<createRawString>(rawch);

                    // Template literal strings ignore all escaped line continuation tokens
                    NotifyScannedNewLine();

                    // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                    m_pchMinLine = p;

                    continue;
                }

                m_currentCharacter = p;
                ScanNewLine(ch);
                p = m_currentCharacter;
                continue;

            case 0:
                if (p >= last)
                {
                    errorType = (uint)ERRnoStrEnd;

ReturnScanError:
                    m_currentCharacter = p - 1;
                    Error(errorType);
                }
                else if (stringTemplateMode)
                {
                    // Escaped null character is translated into 0x0030 for raw template literals
                    rawch = 0x0030;
                }
                break;

            default:
                if (this->IsMultiUnitChar(ch))
                {
                    rawch = ch = this->template ReadRest<true>(ch, p, last);
                    switch (ch)
                    {
                    case kchLS:
                    case kchPS:
                        goto LEcmaEscapeLineBreak;
                    }
                }
                break;
            }
            break;
        }

        m_tempChBuf.AppendCh(ch);
        m_tempChBufSecondary.template AppendCh<createRawString>(rawch);
    }

LBreak:
    bool createPid = true;

    if ((m_DeferredParseFlags & ScanFlagSuppressStrPid) != 0)
    {
        createPid = false;

        if ((m_tempChBuf.m_ichCur == 10) && (0 == memcmp(_u("use strict"), m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur * sizeof(OLECHAR))))
        {
            createPid = true;
        }
    }

    if (createPid)
    {
        m_ptoken->SetIdentifier(this->GetHashTbl()->PidHashNameLen(m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur));
    }
    else
    {
        m_ptoken->SetIdentifier(NULL);
    }

    m_scanState = ScanStateNormal;
    m_doubleQuoteOnLastTkStrCon = '"' == delim;
    *pp = p;

    return tkStrCon;
}